

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHandler.cpp
# Opt level: O2

void __thiscall TgBot::EventHandler::handleUpdate(EventHandler *this,Ptr *update)

{
  EventBroadcaster *pEVar1;
  element_type *peVar2;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  __shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar2 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar2->inlineQuery).super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    pEVar1 = this->_broadcaster;
    std::__shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &(peVar2->inlineQuery).
                super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>);
    EventBroadcaster::broadcastInlineQuery(pEVar1,(Ptr *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    peVar2 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if ((peVar2->chosenInlineResult).
      super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pEVar1 = this->_broadcaster;
    std::__shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               &(peVar2->chosenInlineResult).
                super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>);
    EventBroadcaster::broadcastChosenInlineResult(pEVar1,(Ptr *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    peVar2 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if ((peVar2->callbackQuery).super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    pEVar1 = this->_broadcaster;
    std::__shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(peVar2->callbackQuery).
                super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>);
    EventBroadcaster::broadcastCallbackQuery(pEVar1,(Ptr *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    peVar2 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if ((peVar2->message).super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_68,
               &(peVar2->message).super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>);
    handleMessage(this,(Ptr *)&_Stack_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  }
  return;
}

Assistant:

void EventHandler::handleUpdate(Update::Ptr update) const {
    if (update->inlineQuery != nullptr) {
        _broadcaster.broadcastInlineQuery(update->inlineQuery);
    }
    if (update->chosenInlineResult != nullptr) {
        _broadcaster.broadcastChosenInlineResult(update->chosenInlineResult);
    }
    if (update->callbackQuery != nullptr) {
        _broadcaster.broadcastCallbackQuery(update->callbackQuery);
    }
    if (update->message != nullptr) {
        handleMessage(update->message);
    }
}